

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_wav_uninit(ma_dr_wav *pWav)

{
  int iVar1;
  long *in_RDI;
  ma_uint64 dataChunkSize_2;
  ma_uint64 riffChunkSize_2;
  int ds64BodyPos;
  ma_uint64 dataChunkSize_1;
  ma_uint64 riffChunkSize_1;
  ma_uint32 dataChunkSize;
  ma_uint32 riffChunkSize;
  ma_uint64 paddingData;
  ma_uint32 paddingSize;
  ma_result result;
  ma_dr_wav *in_stack_ffffffffffffffa8;
  ma_dr_wav *in_stack_ffffffffffffffb0;
  ma_dr_wav_metadata *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar2;
  uint local_18;
  ma_result local_14;
  ma_result local_4;
  
  local_14 = MA_SUCCESS;
  if (in_RDI == (long *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDI[1] == 0) {
      ma_dr_wav_free(in_stack_ffffffffffffffb0,(ma_allocation_callbacks *)in_stack_ffffffffffffffa8)
      ;
    }
    else {
      if (((int)in_RDI[8] == 0) || ((int)in_RDI[8] == 3)) {
        local_18 = ma_dr_wav__chunk_padding_size_riff(in_RDI[0x10]);
      }
      else {
        local_18 = ma_dr_wav__chunk_padding_size_w64(in_RDI[0x10]);
      }
      if (local_18 != 0) {
        ma_dr_wav__write(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x235fd5);
      }
      if ((in_RDI[2] != 0) && ((int)in_RDI[0x15] == 0)) {
        if ((int)in_RDI[8] == 0) {
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],4,0);
          if (iVar1 != 0) {
            ma_dr_wav__riff_chunk_size_riff
                      (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,
                       (ma_uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
            ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffffa8,0);
          }
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],(int)in_RDI[0x11] + -4,0);
          if (iVar1 != 0) {
            ma_dr_wav__data_chunk_size_riff(in_RDI[0x10]);
            ma_dr_wav__write_u32ne_to_le(in_stack_ffffffffffffffa8,0);
          }
        }
        else if ((int)in_RDI[8] == 2) {
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],0x10,0);
          if (iVar1 != 0) {
            ma_dr_wav__riff_chunk_size_w64((ma_uint64)in_stack_ffffffffffffffb0);
            ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x236108);
          }
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],(int)in_RDI[0x11] + -8,0);
          if (iVar1 != 0) {
            ma_dr_wav__data_chunk_size_w64(in_RDI[0x10]);
            ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x236159);
          }
        }
        else if ((int)in_RDI[8] == 3) {
          iVar2 = 0x14;
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],0x14,0);
          if (iVar1 != 0) {
            ma_dr_wav__riff_chunk_size_rf64
                      (CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
                       (ma_uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
            ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x2361d3);
          }
          iVar1 = (*(code *)in_RDI[2])(in_RDI[3],iVar2 + 8,0);
          if (iVar1 != 0) {
            ma_dr_wav__data_chunk_size_rf64(in_RDI[0x10]);
            ma_dr_wav__write_u64ne_to_le(in_stack_ffffffffffffffa8,0x23621a);
          }
        }
      }
      if (((int)in_RDI[0x15] != 0) && (in_RDI[0x10] != in_RDI[0x14])) {
        local_14 = MA_INVALID_FILE;
      }
    }
    if (((code *)*in_RDI == ma_dr_wav__on_read_stdio) ||
       ((code *)in_RDI[1] == ma_dr_wav__on_write_stdio)) {
      fclose((FILE *)in_RDI[3]);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_dr_wav_uninit(ma_dr_wav* pWav)
{
    ma_result result = MA_SUCCESS;
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }
    if (pWav->onWrite != NULL) {
        ma_uint32 paddingSize = 0;
        if (pWav->container == ma_dr_wav_container_riff || pWav->container == ma_dr_wav_container_rf64) {
            paddingSize = ma_dr_wav__chunk_padding_size_riff(pWav->dataChunkDataSize);
        } else {
            paddingSize = ma_dr_wav__chunk_padding_size_w64(pWav->dataChunkDataSize);
        }
        if (paddingSize > 0) {
            ma_uint64 paddingData = 0;
            ma_dr_wav__write(pWav, &paddingData, paddingSize);
        }
        if (pWav->onSeek && !pWav->isSequentialWrite) {
            if (pWav->container == ma_dr_wav_container_riff) {
                if (pWav->onSeek(pWav->pUserData, 4, ma_dr_wav_seek_origin_start)) {
                    ma_uint32 riffChunkSize = ma_dr_wav__riff_chunk_size_riff(pWav->dataChunkDataSize, pWav->pMetadata, pWav->metadataCount);
                    ma_dr_wav__write_u32ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos - 4, ma_dr_wav_seek_origin_start)) {
                    ma_uint32 dataChunkSize = ma_dr_wav__data_chunk_size_riff(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u32ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == ma_dr_wav_container_w64) {
                if (pWav->onSeek(pWav->pUserData, 16, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 riffChunkSize = ma_dr_wav__riff_chunk_size_w64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos - 8, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 dataChunkSize = ma_dr_wav__data_chunk_size_w64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            } else if (pWav->container == ma_dr_wav_container_rf64) {
                int ds64BodyPos = 12 + 8;
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 0, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 riffChunkSize = ma_dr_wav__riff_chunk_size_rf64(pWav->dataChunkDataSize, pWav->pMetadata, pWav->metadataCount);
                    ma_dr_wav__write_u64ne_to_le(pWav, riffChunkSize);
                }
                if (pWav->onSeek(pWav->pUserData, ds64BodyPos + 8, ma_dr_wav_seek_origin_start)) {
                    ma_uint64 dataChunkSize = ma_dr_wav__data_chunk_size_rf64(pWav->dataChunkDataSize);
                    ma_dr_wav__write_u64ne_to_le(pWav, dataChunkSize);
                }
            }
        }
        if (pWav->isSequentialWrite) {
            if (pWav->dataChunkDataSize != pWav->dataChunkDataSizeTargetWrite) {
                result = MA_INVALID_FILE;
            }
        }
    } else {
        ma_dr_wav_free(pWav->pMetadata, &pWav->allocationCallbacks);
    }
#ifndef MA_DR_WAV_NO_STDIO
    if (pWav->onRead == ma_dr_wav__on_read_stdio || pWav->onWrite == ma_dr_wav__on_write_stdio) {
        fclose((FILE*)pWav->pUserData);
    }
#endif
    return result;
}